

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

IfGenerateSyntax * __thiscall
slang::parsing::Parser::parseIfGenerateConstruct(Parser *this,AttrList attributes)

{
  bool bVar1;
  ExpressionSyntax *condition;
  MemberSyntax *block;
  MemberSyntax *clause;
  ElseClauseSyntax *elseClause;
  IfGenerateSyntax *pIVar2;
  Token keyword;
  Token openParen;
  Token closeParen;
  Token elseKeyword;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  condition = parseExpression(this);
  closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  block = parseGenerateBlock(this);
  bVar1 = ParserBase::peek(&this->super_ParserBase,ElseKeyword);
  if (bVar1) {
    elseKeyword = ParserBase::consume(&this->super_ParserBase);
    clause = parseGenerateBlock(this);
    elseClause = slang::syntax::SyntaxFactory::elseClause
                           (&this->factory,elseKeyword,&clause->super_SyntaxNode);
  }
  else {
    elseClause = (ElseClauseSyntax *)0x0;
  }
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004703a8;
  local_60.super_SyntaxListBase.childCount = attributes.size_;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       attributes.data_;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ =
       attributes.size_;
  pIVar2 = slang::syntax::SyntaxFactory::ifGenerate
                     (&this->factory,&local_60,keyword,openParen,condition,closeParen,block,
                      elseClause);
  return pIVar2;
}

Assistant:

IfGenerateSyntax& Parser::parseIfGenerateConstruct(AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& condition = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& block = parseGenerateBlock();

    ElseClauseSyntax* elseClause = nullptr;
    if (peek(TokenKind::ElseKeyword)) {
        auto elseKeyword = consume();
        elseClause = &factory.elseClause(elseKeyword, parseGenerateBlock());
    }

    return factory.ifGenerate(attributes, keyword, openParen, condition, closeParen, block,
                              elseClause);
}